

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

uint __thiscall Assimp::XGLImporter::ReadIndexFromText(XGLImporter *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  char *pcStack_28;
  uint t;
  char *se;
  char *s;
  XGLImporter *this_local;
  
  s = (char *)this;
  bVar1 = SkipToText(this);
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar3->_vptr_IIrrXMLReader[0xe])();
    se = (char *)CONCAT44(extraout_var,iVar2);
    bVar1 = SkipSpaces<char>(&se);
    if (bVar1) {
      this_local._4_4_ = strtoul10(se,&stack0xffffffffffffffd8);
      if (pcStack_28 == se) {
        LogFunctions<Assimp::XGLImporter>::LogError("failed to read index");
        this_local._4_4_ = 0xffffffff;
      }
    }
    else {
      LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOL, failed to parse index element");
      this_local._4_4_ = 0xffffffff;
    }
  }
  else {
    LogFunctions<Assimp::XGLImporter>::LogError("unexpected EOF reading index element contents");
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int XGLImporter::ReadIndexFromText()
{
    if(!SkipToText()) {
        LogError("unexpected EOF reading index element contents");
        return ~0u;
    }
    const char* s = m_reader->getNodeData(), *se;
    if(!SkipSpaces(&s)) {
        LogError("unexpected EOL, failed to parse index element");
        return ~0u;
    }

    const unsigned int t = strtoul10(s,&se);

    if (se == s) {
        LogError("failed to read index");
        return ~0u;
    }

    return t;
}